

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_GeneratorFeatureLifetimeError_Test::
~CommandLineInterfaceTest_GeneratorFeatureLifetimeError_Test
          (CommandLineInterfaceTest_GeneratorFeatureLifetimeError_Test *this)

{
  CommandLineInterfaceTest_GeneratorFeatureLifetimeError_Test *this_local;
  
  ~CommandLineInterfaceTest_GeneratorFeatureLifetimeError_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, GeneratorFeatureLifetimeError) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("google/protobuf/unittest_features.proto",
                 pb::TestFeatures::descriptor()->file()->DebugString());
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2024";
    import "google/protobuf/unittest_features.proto";
    package foo;
    message Foo {
      int32 b = 1 [
        features.(pb.test).removed_feature = VALUE6
      ];
    }
  )schema");

  Run("protocol_compiler --experimental_editions --proto_path=$tmpdir "
      "--test_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "foo.proto:6:13: Feature pb.TestFeatures.removed_feature has been "
      "removed in edition 2024");
}